

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trapezoidal_decomposition.cc
# Opt level: O1

QNode_t * __thiscall
PolygonTriangulation::fusion_sinks(PolygonTriangulation *this,QNode_t *top_sink,QNode_t *btm_sink)

{
  uint uVar1;
  uint uVar2;
  pointer pTVar3;
  
  uVar1 = top_sink->key_index;
  pTVar3 = (this->trapezoids_).
           super__Vector_base<PolygonTriangulation::Trapezoid_t,_std::allocator<PolygonTriangulation::Trapezoid_t>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar2 = btm_sink->key_index;
  pTVar3[uVar1].min_y = pTVar3[uVar2].min_y;
  pTVar3[uVar1].below1 = pTVar3[uVar2].below1;
  pTVar3[uVar1].below2 = pTVar3[uVar2].below2;
  return top_sink;
}

Assistant:

PolygonTriangulation::QNode_t* PolygonTriangulation::fusion_sinks(QNode_t *top_sink,
                                                                  QNode_t *btm_sink)
{
  auto &top_trap = trapezoids_[top_sink->key_index];
  const auto &btm_trap = trapezoids_[btm_sink->key_index];

  top_trap.min_y = btm_trap.min_y;

  // used with the second version of update_xsplit
  top_trap.below1 = btm_trap.below1;
  top_trap.below2 = btm_trap.below2;

  //top_trap.above1 = (kInvalidIndex != top_trap.above2) ? top_trap.above2 : top_trap.above1;
  //top_trap.above2 = kInvalidIndex; //

  return top_sink;
}